

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

string * __thiscall
TgBot::TgTypeParser::parseContact_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  string *psVar6;
  string local_40;
  
  peVar2 = (object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar2 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    paVar1 = &local_40.field_2;
    psVar6 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"phone_number","");
    appendToJson((TgTypeParser *)psVar6,__return_storage_ptr__,&local_40,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->phoneNumber);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    psVar6 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"first_name","");
    appendToJson((TgTypeParser *)psVar6,__return_storage_ptr__,&local_40,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->firstName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    psVar6 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"last_name","");
    appendToJson((TgTypeParser *)psVar6,__return_storage_ptr__,&local_40,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->lastName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    psVar6 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"user_id","");
    appendToJson((TgTypeParser *)psVar6,__return_storage_ptr__,&local_40,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->userId);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    psVar6 = &local_40;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"vcard","");
    appendToJson((TgTypeParser *)psVar6,__return_storage_ptr__,&local_40,
                 &((object->super___shared_ptr<TgBot::Contact,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->vcard);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    sVar5 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      uVar4 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",sVar5,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar3);
      }
      _Unwind_Resume(uVar4);
    }
    __return_storage_ptr__->_M_string_length = sVar5;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar5] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseContact(const Contact::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "phone_number", object->phoneNumber);
    appendToJson(result, "first_name", object->firstName);
    appendToJson(result, "last_name", object->lastName);
    appendToJson(result, "user_id", object->userId);
    appendToJson(result, "vcard", object->vcard);
    removeLastComma(result);
    result += '}';
    return result;
}